

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutNode.c
# Opt level: O0

Cut_Cut_t *
Cut_NodeComputeCuts(Cut_Man_t *p,int Node,int Node0,int Node1,int fCompl0,int fCompl1,int fTriv,
                   int TreeCode)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  Cut_Cut_t *pCVar4;
  abctime aVar5;
  Cut_Cut_t *pCVar6;
  abctime aVar7;
  uint *pTruth;
  abctime clk;
  Cut_Cut_t *pCut;
  Cut_Cut_t *pList;
  Cut_List_t *pSuper;
  Cut_List_t Super;
  int fCompl1_local;
  int fCompl0_local;
  int Node1_local;
  int Node0_local;
  int Node_local;
  Cut_Man_t *p_local;
  
  p->nNodes = p->nNodes + 1;
  p->nNodeCuts = 0;
  Super.ppTail[0xc]._4_4_ = fCompl1;
  if (p->pParams->fRecord != 0) {
    pCVar4 = Cut_NodeReadCutsNew(p,Node0);
    Cut_CutNumberList(pCVar4);
    pCVar4 = Cut_NodeReadCutsNew(p,Node1);
    Cut_CutNumberList(pCVar4);
  }
  aVar5 = Abc_Clock();
  Cut_ListStart((Cut_List_t *)&pSuper);
  iVar2 = Super.ppTail[0xc]._4_4_;
  pCVar4 = Cut_NodeReadCutsNew(p,Node0);
  pCVar6 = Cut_NodeReadCutsNew(p,Node1);
  Cut_NodeDoComputeCuts(p,(Cut_List_t *)&pSuper,Node,fCompl0,iVar2,pCVar4,pCVar6,fTriv,TreeCode);
  pCVar4 = Cut_ListFinish((Cut_List_t *)&pSuper);
  aVar7 = Abc_Clock();
  p->timeMerge = (aVar7 - aVar5) + p->timeMerge;
  if (p->pParams->fRecord != 0) {
    pVVar1 = p->vNodeStarts;
    iVar2 = Vec_IntSize(p->vCutPairs);
    Vec_IntWriteEntry(pVVar1,Node,iVar2);
    for (clk = (abctime)pCVar4; clk != 0; clk = *(abctime *)(clk + 0x10)) {
      Vec_IntPush(p->vCutPairs,(*(uint *)clk >> 0xb & 0x7ff) << 0x10 | *(uint *)clk & 0x7ff);
    }
    pVVar1 = p->vNodeCuts;
    iVar2 = Vec_IntSize(p->vCutPairs);
    iVar3 = Vec_IntEntry(p->vNodeStarts,Node);
    Vec_IntWriteEntry(pVVar1,Node,iVar2 - iVar3);
  }
  clk = (abctime)pCVar4;
  if (p->pParams->fRecordAig != 0) {
    for (; clk != 0; clk = *(abctime *)(clk + 0x10)) {
      iVar2 = Cut_CutReadLeaveNum((Cut_Cut_t *)clk);
      if (4 < iVar2) {
        pTruth = Cut_CutReadTruth((Cut_Cut_t *)clk);
        iVar2 = Cut_CutReadLeaveNum((Cut_Cut_t *)clk);
        Aig_RManRecord(pTruth,iVar2);
      }
    }
  }
  if (p->nNodeCuts == p->pParams->nKeepMax) {
    p->nCutsLimit = p->nCutsLimit + 1;
  }
  Vec_PtrFillExtra(p->vCutsNew,Node + 1,(void *)0x0);
  pCVar6 = Cut_NodeReadCutsNew(p,Node);
  if (pCVar6 != (Cut_Cut_t *)0x0) {
    __assert_fail("Cut_NodeReadCutsNew(p, Node) == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutNode.c"
                  ,0x19b,
                  "Cut_Cut_t *Cut_NodeComputeCuts(Cut_Man_t *, int, int, int, int, int, int, int)");
  }
  Cut_NodeWriteCutsNew(p,Node,pCVar4);
  aVar5 = Abc_Clock();
  if ((p->pParams->fMap != 0) && (p->pParams->fSeq == 0)) {
    Cut_NodeMapping(p,pCVar4,Node,Node0,Node1);
  }
  aVar7 = Abc_Clock();
  p->timeMap = (aVar7 - aVar5) + p->timeMap;
  return pCVar4;
}

Assistant:

Cut_Cut_t * Cut_NodeComputeCuts( Cut_Man_t * p, int Node, int Node0, int Node1, int fCompl0, int fCompl1, int fTriv, int TreeCode )
{
    Cut_List_t Super, * pSuper = &Super;
    Cut_Cut_t * pList, * pCut;
    abctime clk;
    // start the number of cuts at the node
    p->nNodes++;
    p->nNodeCuts = 0;
    // prepare information for recording
    if ( p->pParams->fRecord )
    {
        Cut_CutNumberList( Cut_NodeReadCutsNew(p, Node0) );
        Cut_CutNumberList( Cut_NodeReadCutsNew(p, Node1) );
    }
    // compute the cuts
clk = Abc_Clock();
    Cut_ListStart( pSuper );
    Cut_NodeDoComputeCuts( p, pSuper, Node, fCompl0, fCompl1, Cut_NodeReadCutsNew(p, Node0), Cut_NodeReadCutsNew(p, Node1), fTriv, TreeCode );
    pList = Cut_ListFinish( pSuper );
p->timeMerge += Abc_Clock() - clk;
    // verify the result of cut computation
//    Cut_CutListVerify( pList );
    // performing the recording
    if ( p->pParams->fRecord )
    {
        Vec_IntWriteEntry( p->vNodeStarts, Node, Vec_IntSize(p->vCutPairs) );
        Cut_ListForEachCut( pList, pCut )
            Vec_IntPush( p->vCutPairs, ((pCut->Num1 << 16) | pCut->Num0) );
        Vec_IntWriteEntry( p->vNodeCuts, Node, Vec_IntSize(p->vCutPairs) - Vec_IntEntry(p->vNodeStarts, Node) );
    }
    if ( p->pParams->fRecordAig )
    {
        extern void Aig_RManRecord( unsigned * pTruth, int nVarsInit );
        Cut_ListForEachCut( pList, pCut )
            if ( Cut_CutReadLeaveNum(pCut) > 4 )
                Aig_RManRecord( Cut_CutReadTruth(pCut), Cut_CutReadLeaveNum(pCut) );
    }
    // check if the node is over the list
    if ( p->nNodeCuts == p->pParams->nKeepMax )
        p->nCutsLimit++;
    // set the list at the node
    Vec_PtrFillExtra( p->vCutsNew, Node + 1, NULL );
    assert( Cut_NodeReadCutsNew(p, Node) == NULL );
    /////
//    pList->pNext = NULL;
    /////
    Cut_NodeWriteCutsNew( p, Node, pList );
    // filter the cuts
//clk = Abc_Clock();
//    if ( p->pParams->fFilter )
//        Cut_CutFilter( p, pList0 );
//p->timeFilter += Abc_Clock() - clk;
    // perform mapping of this node with these cuts
clk = Abc_Clock();
    if ( p->pParams->fMap && !p->pParams->fSeq )
    {
//        int Delay1, Delay2;
//        Delay1 = Cut_NodeMapping( p, pList, Node, Node0, Node1 );    
//        Delay2 = Cut_NodeMapping2( p, pList, Node, Node0, Node1 );   
//        assert( Delay1 >= Delay2 );
        Cut_NodeMapping( p, pList, Node, Node0, Node1 );
    }
p->timeMap += Abc_Clock() - clk;
    return pList;
}